

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O0

void WebRtcSpl_UpBy2IntToInt(int32_t *in,int32_t len,int32_t *out,int32_t *state)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int32_t i;
  int32_t diff;
  int32_t tmp1;
  int32_t tmp0;
  int32_t *state_local;
  int32_t *out_local;
  int32_t len_local;
  int32_t *in_local;
  
  for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
    iVar1 = state[4] + ((in[local_38] - state[5]) + 0x2000 >> 0xe) * 0x335;
    state[4] = in[local_38];
    local_34 = iVar1 - state[6] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar2 = state[5] + local_34 * 0x17de;
    state[5] = iVar1;
    local_34 = iVar2 - state[7] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[7] = state[6] + local_34 * 0x305e;
    state[6] = iVar2;
    out[local_38 << 1] = state[7];
  }
  for (local_38 = 0; local_38 < len; local_38 = local_38 + 1) {
    iVar1 = *state + ((in[local_38] - state[1]) + 0x2000 >> 0xe) * 0xbea;
    *state = in[local_38];
    local_34 = iVar1 - state[2] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar2 = state[1] + local_34 * 0x2498;
    state[1] = iVar1;
    local_34 = iVar2 - state[3] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[3] = state[2] + local_34 * 0x3ad7;
    state[2] = iVar2;
    out[(long)(local_38 << 1) + 1] = state[3];
  }
  return;
}

Assistant:

void WebRtcSpl_UpBy2IntToInt(const int32_t *in, int32_t len, int32_t *out,
                             int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    // upper allpass filter (generates odd output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // scale down, round and store
        out[i << 1] = state[7];
    }

    out++;

    // lower allpass filter (generates even output samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = in[i];
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // scale down, round and store
        out[i << 1] = state[3];
    }
}